

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::load
          (Literal *__return_storage_ptr__,ExternalInterface *this,Load *load,Address addr,
          Name memory)

{
  uint8_t uVar1;
  BasicType BVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  Literal *pLVar6;
  size_t sVar7;
  char *pcVar8;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  pcVar8 = memory.super_IString.str._M_str;
  sVar7 = memory.super_IString.str._M_len;
  local_38 = __return_storage_ptr__;
  BVar2 = wasm::Type::getBasic
                    (&(load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type);
  switch(BVar2) {
  case none:
  case unreachable:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                       ,0x96d);
  case i32:
    uVar1 = load->bytes;
    if (uVar1 == '\x04') {
      uVar3 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar7,pcVar8);
    }
    else if (uVar1 == '\x02') {
      if (load->signed_ == true) {
        iVar4 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar7,pcVar8);
        uVar3 = (uint)(short)iVar4;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar7,pcVar8);
        uVar3 = uVar3 & 0xffff;
      }
    }
    else {
      if (uVar1 != '\x01') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x94f);
      }
      if (load->signed_ == true) {
        iVar4 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar7,pcVar8);
        uVar3 = (uint)(char)iVar4;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar7,pcVar8);
        uVar3 = uVar3 & 0xff;
      }
    }
    *(uint *)&local_38->field_0 = uVar3;
    (local_38->type).id = 2;
    break;
  case i64:
    switch(load->bytes) {
    case '\x01':
      if (load->signed_ == true) {
        iVar4 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(char)iVar4;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(uVar3 & 0xff);
      }
      break;
    case '\x02':
      if (load->signed_ == true) {
        iVar4 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(short)iVar4;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)(uVar3 & 0xffff);
      }
      break;
    default:
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                         ,0x961);
    case '\x04':
      if (load->signed_ == true) {
        iVar4 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)iVar4;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar7,pcVar8);
        uVar5 = (ulong)uVar3;
      }
      break;
    case '\b':
      iVar4 = (*this->_vptr_ExternalInterface[0x13])(this,addr.addr,sVar7,pcVar8);
      uVar5 = CONCAT44(extraout_var_01,iVar4);
    }
    (local_38->field_0).i64 = uVar5;
    (local_38->type).id = 3;
    break;
  case f32:
    local_50.i32 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar7,pcVar8);
    pLVar6 = local_38;
    local_40 = 2;
    Literal::castToF32(local_38,(Literal *)&local_50.func);
    goto LAB_007841e0;
  case f64:
    iVar4 = (*this->_vptr_ExternalInterface[0x14])(this,addr.addr,sVar7,pcVar8);
    pLVar6 = local_38;
    local_50.i64 = CONCAT44(extraout_var_00,iVar4);
    local_40 = 3;
    Literal::castToF64(local_38,(Literal *)&local_50.func);
LAB_007841e0:
    Literal::~Literal((Literal *)&local_50.func);
    local_38 = pLVar6;
    break;
  case v128:
    iVar4 = (*this->_vptr_ExternalInterface[0x15])
                      (this,addr.addr,(load->memory).super_IString.str._M_len,
                       (load->memory).super_IString.str._M_str);
    pLVar6 = local_38;
    local_50.i64 = CONCAT44(extraout_var,iVar4);
    Literal::Literal(local_38,local_50.v128);
    local_38 = pLVar6;
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                       ,0x96f);
  }
  return local_38;
}

Assistant:

virtual Literal load(Load* load, Address addr, Name memory) {
      switch (load->type.getBasic()) {
        case Type::i32: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int32_t)load8s(addr, memory))
                                   : Literal((int32_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int32_t)load16s(addr, memory))
                                   : Literal((int32_t)load16u(addr, memory));
            case 4:
              return Literal((int32_t)load32s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::i64: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int64_t)load8s(addr, memory))
                                   : Literal((int64_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int64_t)load16s(addr, memory))
                                   : Literal((int64_t)load16u(addr, memory));
            case 4:
              return load->signed_ ? Literal((int64_t)load32s(addr, memory))
                                   : Literal((int64_t)load32u(addr, memory));
            case 8:
              return Literal((int64_t)load64s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f32:
          return Literal(load32u(addr, memory)).castToF32();
        case Type::f64:
          return Literal(load64u(addr, memory)).castToF64();
        case Type::v128:
          return Literal(load128(addr, load->memory).data());
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }